

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwWindowHint(int target,int hint)

{
  char *format;
  int error;
  
  if (_glfwInitialized == '\0') {
    error = 0x10001;
    format = (char *)0x0;
  }
  else {
    switch(target) {
    case 0x21001:
      _glfw.hints.redBits = hint;
      return;
    case 0x21002:
      _glfw.hints.greenBits = hint;
      return;
    case 0x21003:
      _glfw.hints.blueBits = hint;
      return;
    case 0x21004:
      _glfw.hints.alphaBits = hint;
      return;
    case 0x21005:
      _glfw.hints.depthBits = hint;
      return;
    case 0x21006:
      _glfw.hints.stencilBits = hint;
      return;
    case 0x21007:
      _glfw.hints.accumRedBits = hint;
      return;
    case 0x21008:
      _glfw.hints.accumGreenBits = hint;
      return;
    case 0x21009:
      _glfw.hints.accumBlueBits = hint;
      return;
    case 0x2100a:
      _glfw.hints.accumAlphaBits = hint;
      return;
    case 0x2100b:
      _glfw.hints.auxBuffers = hint;
      return;
    case 0x2100c:
      _glfw.hints.stereo = hint;
      return;
    case 0x2100d:
      _glfw.hints.samples = hint;
      return;
    case 0x2100e:
      _glfw.hints.sRGB = hint;
      return;
    case 0x2100f:
      _glfw.hints.refreshRate = hint;
      return;
    case 0x21010:
      _glfw.hints.doublebuffer = hint;
      return;
    }
    switch(target) {
    case 0x22001:
      _glfw.hints.api = hint;
      return;
    case 0x22002:
      _glfw.hints.major = hint;
      return;
    case 0x22003:
      _glfw.hints.minor = hint;
      return;
    case 0x22004:
      goto switchD_001b8f96_caseD_22004;
    case 0x22005:
      _glfw.hints.robustness = hint;
      return;
    case 0x22006:
      _glfw.hints.forward = hint;
      return;
    case 0x22007:
      _glfw.hints.debug = hint;
      return;
    case 0x22008:
      _glfw.hints.profile = hint;
      return;
    case 0x22009:
      _glfw.hints.release = hint;
      return;
    default:
      switch(target) {
      case 0x20001:
        _glfw.hints.focused = hint;
        return;
      case 0x20003:
        _glfw.hints.resizable = hint;
        return;
      case 0x20004:
        _glfw.hints.visible = hint;
        return;
      case 0x20005:
        _glfw.hints.decorated = hint;
        return;
      case 0x20006:
        _glfw.hints.autoIconify = hint;
        return;
      case 0x20007:
        _glfw.hints.floating = hint;
        return;
      }
switchD_001b8f96_caseD_22004:
      format = "Invalid window hint";
      error = 0x10003;
    }
  }
  _glfwInputError(error,format);
  return;
}

Assistant:

GLFWAPI void glfwWindowHint(int target, int hint)
{
    _GLFW_REQUIRE_INIT();

    switch (target)
    {
        case GLFW_RED_BITS:
            _glfw.hints.redBits = hint;
            break;
        case GLFW_GREEN_BITS:
            _glfw.hints.greenBits = hint;
            break;
        case GLFW_BLUE_BITS:
            _glfw.hints.blueBits = hint;
            break;
        case GLFW_ALPHA_BITS:
            _glfw.hints.alphaBits = hint;
            break;
        case GLFW_DEPTH_BITS:
            _glfw.hints.depthBits = hint;
            break;
        case GLFW_STENCIL_BITS:
            _glfw.hints.stencilBits = hint;
            break;
        case GLFW_ACCUM_RED_BITS:
            _glfw.hints.accumRedBits = hint;
            break;
        case GLFW_ACCUM_GREEN_BITS:
            _glfw.hints.accumGreenBits = hint;
            break;
        case GLFW_ACCUM_BLUE_BITS:
            _glfw.hints.accumBlueBits = hint;
            break;
        case GLFW_ACCUM_ALPHA_BITS:
            _glfw.hints.accumAlphaBits = hint;
            break;
        case GLFW_AUX_BUFFERS:
            _glfw.hints.auxBuffers = hint;
            break;
        case GLFW_STEREO:
            _glfw.hints.stereo = hint;
            break;
        case GLFW_REFRESH_RATE:
            _glfw.hints.refreshRate = hint;
            break;
        case GLFW_DOUBLEBUFFER:
            _glfw.hints.doublebuffer = hint;
            break;
        case GLFW_RESIZABLE:
            _glfw.hints.resizable = hint;
            break;
        case GLFW_DECORATED:
            _glfw.hints.decorated = hint;
            break;
        case GLFW_FOCUSED:
            _glfw.hints.focused = hint;
            break;
        case GLFW_AUTO_ICONIFY:
            _glfw.hints.autoIconify = hint;
            break;
        case GLFW_FLOATING:
            _glfw.hints.floating = hint;
            break;
        case GLFW_VISIBLE:
            _glfw.hints.visible = hint;
            break;
        case GLFW_SAMPLES:
            _glfw.hints.samples = hint;
            break;
        case GLFW_SRGB_CAPABLE:
            _glfw.hints.sRGB = hint;
            break;
        case GLFW_CLIENT_API:
            _glfw.hints.api = hint;
            break;
        case GLFW_CONTEXT_VERSION_MAJOR:
            _glfw.hints.major = hint;
            break;
        case GLFW_CONTEXT_VERSION_MINOR:
            _glfw.hints.minor = hint;
            break;
        case GLFW_CONTEXT_ROBUSTNESS:
            _glfw.hints.robustness = hint;
            break;
        case GLFW_OPENGL_FORWARD_COMPAT:
            _glfw.hints.forward = hint;
            break;
        case GLFW_OPENGL_DEBUG_CONTEXT:
            _glfw.hints.debug = hint;
            break;
        case GLFW_OPENGL_PROFILE:
            _glfw.hints.profile = hint;
            break;
        case GLFW_CONTEXT_RELEASE_BEHAVIOR:
            _glfw.hints.release = hint;
            break;
        default:
            _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint");
            break;
    }
}